

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CropResizeLayerParams::CropResizeLayerParams
          (CropResizeLayerParams *this,CropResizeLayerParams *from)

{
  ulong uVar1;
  SamplingMode *from_00;
  BoxCoordinatesMode *from_01;
  undefined3 uVar2;
  float fVar3;
  SamplingMode *this_00;
  BoxCoordinatesMode *this_01;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CropResizeLayerParams_00489080;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->targetsize_,&from->targetsize_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  from_00 = from->mode_;
  if (from_00 == (SamplingMode *)0x0 ||
      from == (CropResizeLayerParams *)_CropResizeLayerParams_default_instance_) {
    this_00 = (SamplingMode *)0x0;
  }
  else {
    this_00 = (SamplingMode *)operator_new(0x18);
    SamplingMode::SamplingMode(this_00,from_00);
  }
  this->mode_ = this_00;
  from_01 = from->boxindicesmode_;
  if (from_01 == (BoxCoordinatesMode *)0x0 ||
      from == (CropResizeLayerParams *)_CropResizeLayerParams_default_instance_) {
    this_01 = (BoxCoordinatesMode *)0x0;
  }
  else {
    this_01 = (BoxCoordinatesMode *)operator_new(0x18);
    BoxCoordinatesMode::BoxCoordinatesMode(this_01,from_01);
  }
  this->boxindicesmode_ = this_01;
  uVar2 = *(undefined3 *)&from->field_0x39;
  fVar3 = from->spatialscale_;
  this->normalizedcoordinates_ = from->normalizedcoordinates_;
  *(undefined3 *)&this->field_0x39 = uVar2;
  this->spatialscale_ = fVar3;
  return;
}

Assistant:

CropResizeLayerParams::CropResizeLayerParams(const CropResizeLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      targetsize_(from.targetsize_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_mode()) {
    mode_ = new ::CoreML::Specification::SamplingMode(*from.mode_);
  } else {
    mode_ = nullptr;
  }
  if (from._internal_has_boxindicesmode()) {
    boxindicesmode_ = new ::CoreML::Specification::BoxCoordinatesMode(*from.boxindicesmode_);
  } else {
    boxindicesmode_ = nullptr;
  }
  ::memcpy(&normalizedcoordinates_, &from.normalizedcoordinates_,
    static_cast<size_t>(reinterpret_cast<char*>(&spatialscale_) -
    reinterpret_cast<char*>(&normalizedcoordinates_)) + sizeof(spatialscale_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CropResizeLayerParams)
}